

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::UpdateRegionForBlock(FlowGraph *this,BasicBlock *block)

{
  code *pcVar1;
  FlowEdge **ppFVar2;
  IRKind IVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  FlowGraph *this_00;
  Region *pRVar7;
  undefined4 *puVar8;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  Type_conflict pSVar10;
  Type *ppFVar11;
  BasicBlock *pBVar12;
  Instr *pIVar13;
  LabelInstr *pLVar14;
  bool local_111;
  bool local_101;
  BasicBlock *local_100;
  bool local_e2;
  bool local_e1;
  bool local_c9;
  BasicBlock *predBlock_1;
  FlowEdge **__edge_1;
  Iterator __iter_1;
  LabelInstr *labelInstr;
  BasicBlock *endOfFinally;
  BasicBlock *predBlock;
  FlowEdge **__edge;
  Iterator __iter;
  bool assignRegionsBeforeGlobopt;
  Instr *firstInstr;
  Instr *tryInstr;
  Region *predRegion;
  Region *region;
  BasicBlock *block_local;
  FlowGraph *this_local;
  FlowGraph *local_38;
  FlowGraph *local_30;
  FlowEdge ***local_28;
  bool local_19;
  FlowEdge ***local_18;
  bool local_9;
  
  tryInstr = (Instr *)0x0;
  firstInstr = (Instr *)0x0;
  region = (Region *)block;
  block_local = (BasicBlock *)this;
  this_00 = (FlowGraph *)BasicBlock::GetFirstInstr(block);
  local_30 = this_00;
  IVar3 = IR::Instr::GetKind((Instr *)this_00);
  local_c9 = true;
  if (IVar3 != InstrKindLabel) {
    local_c9 = IR::Instr::IsProfiledLabelInstr((Instr *)this_00);
  }
  if (local_c9 != false) {
    pLVar14 = IR::Instr::AsLabelInstr((Instr *)this_00);
    pRVar7 = IR::LabelInstr::GetRegion(pLVar14);
    if (pRVar7 != (Region *)0x0) {
      BVar5 = Func::HasTry(this->func);
      local_e1 = false;
      if (BVar5 != 0) {
        bVar4 = Func::DoOptimizeTry(this->func);
        local_e2 = true;
        if ((!bVar4) &&
           ((bVar4 = Func::IsSimpleJit(this->func), !bVar4 ||
            (local_e2 = true, (*(uint *)&this->func->field_0x240 >> 4 & 1) == 0)))) {
          local_e2 = Func::IsLoopBodyInTryFinally(this->func);
        }
        local_e1 = local_e2;
      }
      __iter.current._7_1_ = local_e1;
      if (local_e1 != false) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x77c,"(assignRegionsBeforeGlobopt)","assignRegionsBeforeGlobopt");
      if (bVar4) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if ((BasicBlock *)region == this->blockList) {
    predRegion = Region::New(RegionTypeRoot,(Region *)0x0,this->func);
  }
  else {
    predRegion = (Region *)0x0;
    pSVar9 = &BasicBlock::GetPredList((BasicBlock *)region)->
              super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar9);
    do {
      local_18 = &__edge;
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppFVar2 = __edge;
      pSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,pSVar10
                        );
      if (!bVar4) {
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_9 = !bVar4;
      if (!local_9) goto LAB_0052e06e;
      ppFVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge);
      pBVar12 = FlowEdge::GetPred(*ppFVar11);
      if (pBVar12 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78a,"(predBlock)","predBlock");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      uVar6 = BasicBlock::GetBlockNum(pBVar12);
      if (this->blockCount <= uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78c,"(predBlock->GetBlockNum() < this->blockCount)",
                           "Misnumbered block at teardown time?");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pIVar13 = BasicBlock::GetFirstInstr(pBVar12);
      pLVar14 = IR::Instr::AsLabelInstr(pIVar13);
      tryInstr = (Instr *)IR::LabelInstr::GetRegion(pLVar14);
    } while ((Region *)tryInstr == (Region *)0x0);
    predRegion = PropagateRegionFromPred
                           (this,(BasicBlock *)region,pBVar12,(Region *)tryInstr,&firstInstr);
LAB_0052e06e:
    pIVar13 = BasicBlock::GetLastInstr((BasicBlock *)region);
    if ((((pIVar13->m_opcode == LeaveNull) ||
         (pIVar13 = BasicBlock::GetLastInstr((BasicBlock *)region), pIVar13->m_opcode == Leave)) &&
        (this->regToFinallyEndMap != (RegionToFinallyEndMapType *)0x0)) &&
       (bVar4 = Region::IsNonExceptingFinally(predRegion), bVar4)) {
      bVar4 = JsUtil::
              BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this->regToFinallyEndMap,&predRegion);
      if (bVar4) {
        local_100 = JsUtil::
                    BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::Item(this->regToFinallyEndMap,&predRegion);
      }
      else {
        local_100 = (BasicBlock *)0x0;
      }
      if (local_100 == (BasicBlock *)0x0) {
        JsUtil::
        BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(this->regToFinallyEndMap,&predRegion,(BasicBlock **)&region);
      }
      else {
        pIVar13 = BasicBlock::GetLastInstr(local_100);
        if ((pIVar13->m_opcode == LeaveNull) && ((BasicBlock *)region != local_100)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7a1,
                             "(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally)"
                             ,
                             "endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally"
                            );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        JsUtil::
        BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(this->regToFinallyEndMap,&predRegion,(BasicBlock **)&region);
      }
    }
  }
  if ((predRegion != (Region *)0x0) && (predRegion->ehBailoutData == (EHBailoutData *)0x0)) {
    Region::AllocateEHBailoutData(predRegion,this->func,firstInstr);
  }
  local_38 = this_00;
  IVar3 = IR::Instr::GetKind((Instr *)this_00);
  local_101 = true;
  if (IVar3 != InstrKindLabel) {
    local_101 = IR::Instr::IsProfiledLabelInstr((Instr *)this_00);
  }
  if (local_101 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7ad,"(firstInstr->IsLabelInstr())","firstInstr->IsLabelInstr()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_local = this_00;
  IVar3 = IR::Instr::GetKind((Instr *)this_00);
  local_111 = true;
  if (IVar3 != InstrKindLabel) {
    local_111 = IR::Instr::IsProfiledLabelInstr((Instr *)this_00);
  }
  if (local_111 != false) {
    __iter_1.current = (NodeBase *)IR::Instr::AsLabelInstr((Instr *)this_00);
    IR::LabelInstr::SetRegion((LabelInstr *)__iter_1.current,predRegion);
    if (predRegion != (Region *)tryInstr) {
      *(byte *)&__iter_1.current[0xf].next = *(byte *)&__iter_1.current[0xf].next & 0xfb | 4;
    }
    if ((*(byte *)&__iter_1.current[0xf].next >> 2 & 1) == 0) {
      pSVar9 = &BasicBlock::GetPredList((BasicBlock *)region)->
                super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      ___edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar9);
      do {
        local_28 = &__edge_1;
        if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        ppFVar2 = __edge_1;
        pSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,
                           pSVar10);
        if (!bVar4) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_19 = !bVar4;
        if (!local_19) {
          return;
        }
        ppFVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__edge_1);
        pBVar12 = FlowEdge::GetPred(*ppFVar11);
        if (pBVar12 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7bf,"(predBlock)","predBlock");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        uVar6 = BasicBlock::GetBlockNum(pBVar12);
        if (this->blockCount <= uVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7c1,"(predBlock->GetBlockNum() < this->blockCount)",
                             "Misnumbered block at teardown time?");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pIVar13 = BasicBlock::GetFirstInstr(pBVar12);
        pLVar14 = IR::Instr::AsLabelInstr(pIVar13);
        tryInstr = (Instr *)IR::LabelInstr::GetRegion(pLVar14);
      } while ((Region *)tryInstr == predRegion);
      *(byte *)&__iter_1.current[0xf].next = *(byte *)&__iter_1.current[0xf].next & 0xfb | 4;
    }
  }
  return;
}

Assistant:

void
FlowGraph::UpdateRegionForBlock(BasicBlock * block)
{
    Region *region;
    Region * predRegion = nullptr;
    IR::Instr * tryInstr = nullptr;
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->GetRegion())
    {
#if DBG
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
        (this->func->IsSimpleJit() && this->func->hasBailout) ||
        this->func->IsLoopBodyInTryFinally());
        Assert(assignRegionsBeforeGlobopt);
#endif
        return;
    }

    if (block == this->blockList)
    {
        // Head of the graph: create the root region.
        region = Region::New(RegionTypeRoot, nullptr, this->func);
    }
    else
    {
        // Propagate the region forward by finding a predecessor we've already processed.
        region = nullptr;
        FOREACH_PREDECESSOR_BLOCK(predBlock, block)
        {
            AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
            predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
            if (predRegion != nullptr)
            {
                region = this->PropagateRegionFromPred(block, predBlock, predRegion, tryInstr);
                break;
            }
        }
        NEXT_PREDECESSOR_BLOCK;

        if (block->GetLastInstr()->m_opcode == Js::OpCode::LeaveNull || block->GetLastInstr()->m_opcode == Js::OpCode::Leave)
        {
            if (this->regToFinallyEndMap && region->IsNonExceptingFinally())
            {
                BasicBlock *endOfFinally = regToFinallyEndMap->ContainsKey(region) ? regToFinallyEndMap->Item(region) : nullptr;
                if (!endOfFinally)
                {
                    regToFinallyEndMap->Add(region, block);
                }
                else
                {
                    Assert(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally);
                    regToFinallyEndMap->Item(region, block);
                }
            }
        }
    }

    if (region && !region->ehBailoutData)
    {
        region->AllocateEHBailoutData(this->func, tryInstr);
    }

    Assert(firstInstr->IsLabelInstr());
    if (firstInstr->IsLabelInstr())
    {
        // Record the region on the label and make sure it stays around as a region
        // marker if we're entering a region at this point.
        IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
        labelInstr->SetRegion(region);
        if (region != predRegion)
        {
            labelInstr->m_hasNonBranchRef = true;
        }

        // One of the pred blocks maybe an eh region, in that case it is important to mark this label's m_hasNonBranchRef
        // If not later in codegen, this label can get deleted. And during SccLiveness, region is propagated to newly created labels in lowerer from the previous label's region
        // We can end up assigning an eh region to a label in a non eh region. And if there is a bailout in such a region, bad things will happen in the interpreter :)
        // See test2()/test3() in tryfinallytests.js
        if (!labelInstr->m_hasNonBranchRef)
        {
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
                predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predRegion != region)
                {
                    labelInstr->m_hasNonBranchRef = true;
                    break;
                }
            }
            NEXT_PREDECESSOR_BLOCK;
        }
    }
}